

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O0

void proto3::MapOutWireFormat_Map4Entry::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MapOutWireFormat_Map4Entry *pMVar2;
  MessageLite *value;
  string *value_00;
  bool bVar3;
  MapOutWireFormat_Map4Entry **v1;
  MapOutWireFormat_Map4Entry **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  ulong uVar6;
  Arena *pAVar7;
  allocator<char> local_b1;
  MessageLite local_b0 [2];
  uint local_90;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  MapOutWireFormat_Map4Entry *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  MapOutWireFormat_Map4Entry *from;
  MapOutWireFormat_Map4Entry *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  MapOutWireFormat_Map4Entry *local_30;
  anon_union_24_1_493b367e_for_MapOutWireFormat_Map4Entry_3 *local_28;
  string *local_20;
  MapOutWireFormat_Map4Entry *local_18;
  anon_union_24_1_493b367e_for_MapOutWireFormat_Map4Entry_3 *local_10;
  
  local_68 = (MapOutWireFormat_Map4Entry *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (MapOutWireFormat_Map4Entry *)to_msg;
  _this = (MapOutWireFormat_Map4Entry *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto3::MapOutWireFormat_Map4Entry_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto3::MapOutWireFormat_Map4Entry*>
                 (&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto3::MapOutWireFormat_Map4Entry_const*,proto3::MapOutWireFormat_Map4Entry*>
                       (v1,v2,"&from != _this");
  if (local_60 == (Nullable<const_char_*>)0x0) {
    local_90 = 0;
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    local_90 = *puVar5;
    if ((local_90 & 3) != 0) {
      if ((local_90 & 1) != 0) {
        _internal_value_abi_cxx11_((MapOutWireFormat_Map4Entry *)absl_log_internal_check_op_result);
        uVar6 = std::__cxx11::string::empty();
        pMVar2 = from;
        if ((uVar6 & 1) == 0) {
          local_20 = _internal_value_abi_cxx11_
                               ((MapOutWireFormat_Map4Entry *)absl_log_internal_check_op_result);
          local_18 = pMVar2;
          local_10 = &pMVar2->field_0;
          puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                             (&(pMVar2->field_0)._impl_._has_bits_,0);
          value_00 = local_20;
          *puVar5 = *puVar5 | 1;
          pAVar7 = google::protobuf::MessageLite::GetArena((MessageLite *)pMVar2);
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pMVar2->field_0)._impl_.value_,value_00,pAVar7);
        }
        else {
          bVar3 = google::protobuf::internal::ArenaStringPtr::IsDefault
                            (&(from->field_0)._impl_.value_);
          pMVar2 = from;
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_b0,anon_var_dwarf_37cdd0 + 5,&local_b1);
            local_30 = pMVar2;
            to_msg_local = local_b0;
            local_28 = &pMVar2->field_0;
            puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                               (&(local_28->_impl_)._has_bits_,0);
            value = to_msg_local;
            *(byte *)puVar5 = (byte)*puVar5 | 1;
            pAVar7 = google::protobuf::MessageLite::GetArena((MessageLite *)pMVar2);
            google::protobuf::internal::ArenaStringPtr::Set<>
                      (&(pMVar2->field_0)._impl_.value_,(string *)value,pAVar7);
            std::__cxx11::string::~string((string *)local_b0);
            std::allocator<char>::~allocator(&local_b1);
          }
        }
      }
      if (((local_90 & 2) != 0) &&
         (bVar3 = _internal_key((MapOutWireFormat_Map4Entry *)absl_log_internal_check_op_result),
         bVar3)) {
        (from->field_0)._impl_.key_ = (bool)(absl_log_internal_check_op_result[0x20] & 1);
      }
    }
    uVar1 = local_90;
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar5 = uVar1 | *puVar5;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/util/json_format_proto3.pb.cc"
             ,0x4a2a,failure_msg);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

void MapOutWireFormat_Map4Entry::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<MapOutWireFormat_Map4Entry*>(&to_msg);
  auto& from = static_cast<const MapOutWireFormat_Map4Entry&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3.MapOutWireFormat.Map4Entry)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_value().empty()) {
        _this->_internal_set_value(from._internal_value());
      } else {
        if (_this->_impl_.value_.IsDefault()) {
          _this->_internal_set_value("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_key() != 0) {
        _this->_impl_.key_ = from._impl_.key_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}